

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O2

bool __thiscall
GlobOpt::IsOperationThatLikelyKillsJsArraysWithNoMissingValues(GlobOpt *this,Instr *instr)

{
  ProfiledInstr *pPVar1;
  
  if ((((instr->m_opcode == StElemI_A_Strict) || (instr->m_opcode == StElemI_A)) &&
      ((this->field_0xf5 & 0x80) != 0)) && (instr->m_kind == InstrKindProfiled)) {
    pPVar1 = IR::Instr::AsProfiledInstr(instr);
    return (bool)(((((pPVar1->u).stElemInfo)->field_2).bits & 2) >> 1);
  }
  return false;
}

Assistant:

bool
GlobOpt::IsOperationThatLikelyKillsJsArraysWithNoMissingValues(IR::Instr *const instr)
{
    // StElem is profiled with information indicating whether it will likely create a missing value in the array. In that case,
    // we prefer to kill the no-missing-values information in the value so that we don't bail out in a likely circumstance.
    return
        (instr->m_opcode == Js::OpCode::StElemI_A || instr->m_opcode == Js::OpCode::StElemI_A_Strict) &&
        DoArrayMissingValueCheckHoist() &&
        instr->IsProfiledInstr() &&
        instr->AsProfiledInstr()->u.stElemInfo->LikelyCreatesMissingValue();
}